

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcPrsGramNode * __thiscall CTcParser::flatten_gram_rule(CTcParser *this,int *err)

{
  CTcTokenSource *pCVar1;
  int iVar2;
  CTcPrsGramNode *pCVar3;
  undefined4 extraout_var;
  CTcPrsGramNode *__s;
  CTcPrsGramNode *pCVar4;
  
  __s = (CTcPrsGramNode *)0x0;
  pCVar3 = parse_gram_or(this,err,0);
  if (pCVar3 != (CTcPrsGramNode *)0x0) {
    if (*err == 0) {
      iVar2 = (*(pCVar3->super_CTcTokenSource)._vptr_CTcTokenSource[3])(pCVar3);
      pCVar3 = (CTcPrsGramNode *)CONCAT44(extraout_var,iVar2);
      (*(pCVar3->super_CTcTokenSource)._vptr_CTcTokenSource[4])(pCVar3);
      iVar2 = (*(pCVar3->super_CTcTokenSource)._vptr_CTcTokenSource[5])(pCVar3);
      __s = pCVar3;
      if (iVar2 == 0) {
        __s = (CTcPrsGramNode *)CTcPrsMem::alloc(G_prsmem,0x88);
        memset(__s,0,0x88);
        (__s->super_CTcTokenSource)._vptr_CTcTokenSource =
             (_func_int **)&PTR__CTcTokenSource_0035ee88;
        pCVar1 = __s[1].super_CTcTokenSource.enclosing_src_;
        pCVar4 = (CTcPrsGramNode *)(pCVar1 + 1);
        if (pCVar1 == (CTcTokenSource *)0x0) {
          pCVar4 = __s + 1;
        }
        (pCVar4->super_CTcTokenSource)._vptr_CTcTokenSource = (_func_int **)pCVar3;
        __s[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)pCVar3;
        pCVar3->next_ = (CTcPrsGramNode *)0x0;
      }
      (*(__s->super_CTcTokenSource)._vptr_CTcTokenSource[8])(__s);
    }
    else {
      __s = (CTcPrsGramNode *)0x0;
    }
  }
  return __s;
}

Assistant:

CTcPrsGramNode *CTcParser::flatten_gram_rule(int *err)
{
    /* first, build the top-level 'or' tree */
    CTcPrsGramNode *tree = parse_gram_or(err, 0);
    if (tree == 0 || *err != 0)
        return 0;

    /* move all of the OR's to a single OR at the top of the tree */
    tree = tree->consolidate_or();

    /* flatten CAT nodes in the resulting tree */
    tree->flatten_cat();

    /* 
     *   if the top-level node isn't an OR, insert an OR at the top - this
     *   makes the tree always follow the same shape, which makes it easier
     *   to step through the tokens in the expansion
     */
    if (!tree->is_or())
    {
        CTcPrsGramNodeOr *new_or;

        /* create an OR node for the root of the tree */
        new_or = new (G_prsmem) CTcPrsGramNodeOr();

        /* insert our old root as the single alternative under the OR */
        new_or->add_sub_item(tree);

        /* the OR is now the root of the tree */
        tree = new_or;
    }

    /* start reading from the first token in the tree */
    tree->init_expansion();

    /* return the tree */
    return tree;
}